

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

void update_mem_availability(gen_ctx_t gen_ctx,bitmap_t mem_av,bb_insn_t_conflict mem_bb_insn)

{
  char cVar1;
  uint uVar2;
  MIR_insn_t pMVar3;
  ulong uVar4;
  VARR_mem_expr_t *pVVar5;
  byte bVar6;
  bool bVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  MIR_insn_t mem2;
  ulong uVar12;
  ulong unaff_R14;
  
  pMVar3 = mem_bb_insn->insn;
  if ((*(uint *)&pMVar3->field_0x18 & 0xfffffffc) != 0) {
LAB_00166f07:
    __assert_fail("move_code_p (mem_bb_insn->insn->code)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0xda9,"void update_mem_availability(gen_ctx_t, bitmap_t, bb_insn_t)");
  }
  cVar1 = pMVar3->ops[0].field_0x8;
  mem2 = (MIR_insn_t)pMVar3->ops;
  if (cVar1 != '\v') {
    mem2 = pMVar3 + 1;
  }
  if (*(char *)&(mem2->insn_link).prev != '\v') {
    __assert_fail("mem_ref->mode == MIR_OP_VAR_MEM",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0xdab,"void update_mem_availability(gen_ctx_t, bitmap_t, bb_insn_t)");
  }
  if (mem_av != (bitmap_t)0x0) {
    uVar12 = 0;
    do {
      uVar9 = uVar12 >> 6;
      uVar4 = mem_av->els_num;
      bVar7 = true;
      uVar10 = uVar12;
      if (uVar9 < uVar4) {
        uVar10 = uVar4 << 6;
LAB_00166dea:
        if ((mem_av->varr[uVar9] == 0) ||
           (uVar11 = mem_av->varr[uVar9] >> (uVar12 & 0x3f), uVar11 == 0)) goto LAB_00166dfd;
        uVar4 = uVar11 & 1;
        unaff_R14 = uVar12;
        while (uVar4 == 0) {
          unaff_R14 = unaff_R14 + 1;
          uVar4 = uVar11 & 2;
          uVar11 = uVar11 >> 1;
        }
        uVar10 = unaff_R14 + 1;
        bVar7 = false;
      }
LAB_00166e31:
      if (bVar7) goto LAB_00166ec7;
      pVVar5 = gen_ctx->gvn_ctx->mem_exprs;
      if (((pVVar5 == (VARR_mem_expr_t *)0x0) || (pVVar5->varr == (mem_expr_t *)0x0)) ||
         (pVVar5->els_num <= unaff_R14)) {
        update_mem_availability_cold_1();
        goto LAB_00166f07;
      }
      if (((cVar1 == '\v') &&
          (pMVar3 = pVVar5->varr[unaff_R14]->insn,
          iVar8 = may_mem_alias_p((MIR_op_t *)
                                  ((long)&pMVar3->ops[0].data +
                                  (ulong)((uint)(pMVar3->ops[0].field_0x8 != '\v') * 0x30)),
                                  (MIR_op_t *)mem2), iVar8 != 0)) &&
         (unaff_R14 < mem_av->els_num << 6)) {
        bVar6 = (byte)unaff_R14 & 0x3f;
        mem_av->varr[unaff_R14 >> 6] =
             mem_av->varr[unaff_R14 >> 6] & (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
      }
      uVar12 = uVar10;
    } while (mem_av != (bitmap_t)0x0);
  }
  update_mem_availability_cold_2();
LAB_00166ec7:
  uVar2 = mem_bb_insn->mem_index;
  bitmap_expand(mem_av,(ulong)uVar2 + 1);
  mem_av->varr[uVar2 >> 6] = mem_av->varr[uVar2 >> 6] | 1L << ((ulong)uVar2 & 0x3f);
  return;
LAB_00166dfd:
  uVar9 = uVar9 + 1;
  uVar12 = uVar9 * 0x40;
  if (uVar4 == uVar9) goto LAB_00166e31;
  goto LAB_00166dea;
}

Assistant:

static void update_mem_availability (gen_ctx_t gen_ctx, bitmap_t mem_av, bb_insn_t mem_bb_insn) {
  size_t nel;
  bitmap_iterator_t bi;
  MIR_insn_t mem_insn;
  MIR_op_t *mem_ref = &mem_bb_insn->insn->ops[0];
  int ld_p;

  gen_assert (move_code_p (mem_bb_insn->insn->code));
  if ((ld_p = mem_ref->mode != MIR_OP_VAR_MEM)) mem_ref = &mem_bb_insn->insn->ops[1];
  gen_assert (mem_ref->mode == MIR_OP_VAR_MEM);
  FOREACH_BITMAP_BIT (bi, mem_av, nel) {
    mem_insn = VARR_GET (mem_expr_t, mem_exprs, nel)->insn;
    if (!ld_p
        && may_mem_alias_p (&mem_insn->ops[mem_insn->ops[0].mode == MIR_OP_VAR_MEM ? 0 : 1],
                            mem_ref))
      bitmap_clear_bit_p (mem_av, nel);
  }
  bitmap_set_bit_p (mem_av, mem_bb_insn->mem_index);
}